

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetSourcesCommand.cxx
# Opt level: O3

bool __thiscall
cmTargetSourcesCommand::InitialPass
          (cmTargetSourcesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  bool bVar1;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"SOURCES","");
  bVar1 = cmTargetPropCommandBase::HandleArguments
                    (&this->super_cmTargetPropCommandBase,args,&local_40,NO_FLAGS);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmTargetSourcesCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  return this->HandleArguments(args, "SOURCES");
}